

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

DescriptorCache * __thiscall
DescriptorCache::MergeAndDiff
          (DescriptorCache *__return_storage_ptr__,DescriptorCache *this,DescriptorCache *other)

{
  bool bVar1;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var2;
  mapped_type *pmVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  __node_base _Var8;
  _Hash_node_base *p_Var9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  mapped_type *pmVar12;
  long in_FS_OFFSET;
  byte bVar13;
  __alloc_node_gen_t __alloc_node_gen;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  size_type *local_d0;
  size_type local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  CExtPubKey local_b0;
  long local_38;
  
  bVar13 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_buckets =
       &(__return_storage_ptr__->m_derived_xpubs)._M_h._M_single_bucket;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_element_count = 0;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->m_derived_xpubs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_buckets =
       &(__return_storage_ptr__->m_parent_xpubs)._M_h._M_single_bucket;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_element_count = 0;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->m_parent_xpubs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_buckets =
       &(__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_single_bucket;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_element_count = 0;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->m_last_hardened_xpubs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0._0_8_ = &local_128;
  local_128._M_buckets = (__buckets_ptr)0x0;
  local_128._M_bucket_count = (other->m_parent_xpubs)._M_h._M_bucket_count;
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = (other->m_parent_xpubs)._M_h._M_element_count;
  local_128._M_rehash_policy._M_max_load_factor =
       (other->m_parent_xpubs)._M_h._M_rehash_policy._M_max_load_factor;
  local_128._M_rehash_policy._4_4_ =
       *(undefined4 *)&(other->m_parent_xpubs)._M_h._M_rehash_policy.field_0x4;
  local_128._M_rehash_policy._M_next_resize =
       (other->m_parent_xpubs)._M_h._M_rehash_policy._M_next_resize;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,CExtPubKey>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_b0._0_8_,&(other->m_parent_xpubs)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_CExtPubKey>,_false>_>_>
              *)&local_b0);
  if (local_128._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_128._M_before_begin._M_nxt;
    do {
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_b0.pubkey.vch[0] = 0xff;
      bVar1 = GetCachedParentExtPubKey(this,*(uint32_t *)&_Var8._M_nxt[1]._M_nxt,&local_b0);
      if (bVar1) {
        bVar1 = ::operator==(&local_b0,(CExtPubKey *)((long)&_Var8._M_nxt[1]._M_nxt + 4));
        if (!bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"MergeAndDiff","");
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f0,
                          ": New cached parent xpub does not match already cached parent xpub");
          local_d0 = (size_type *)(pbVar5->_M_dataplus)._M_p;
          paVar7 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0 == paVar7) {
            local_c0 = paVar7->_M_allocated_capacity;
            uStack_b8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_d0 = &local_c0;
          }
          else {
            local_c0 = paVar7->_M_allocated_capacity;
          }
          local_c8 = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_006e5c71;
        }
      }
      else {
        local_d0._0_4_ = *(undefined4 *)&_Var8._M_nxt[1]._M_nxt;
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->m_parent_xpubs,(key_type *)&local_d0);
        puVar11 = (undefined4 *)((long)&_Var8._M_nxt[1]._M_nxt + 4);
        puVar10 = puVar11;
        pmVar12 = pmVar3;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)pmVar12->version = *puVar10;
          puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
          pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
        }
        (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&_Var8._M_nxt[0xf]._M_nxt + 4);
        local_d0 = (size_type *)CONCAT44(local_d0._4_4_,*(undefined4 *)&_Var8._M_nxt[1]._M_nxt);
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&__return_storage_ptr__->m_parent_xpubs,(key_type *)&local_d0);
        pmVar12 = pmVar3;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)pmVar12->version = *puVar11;
          puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
          pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
        }
        (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&_Var8._M_nxt[0xf]._M_nxt + 4);
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128);
  local_128._M_buckets = (__buckets_ptr)0x0;
  local_128._M_bucket_count = (other->m_derived_xpubs)._M_h._M_bucket_count;
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = (other->m_derived_xpubs)._M_h._M_element_count;
  local_128._M_rehash_policy._M_max_load_factor =
       (other->m_derived_xpubs)._M_h._M_rehash_policy._M_max_load_factor;
  local_128._M_rehash_policy._4_4_ =
       *(undefined4 *)&(other->m_derived_xpubs)._M_h._M_rehash_policy.field_0x4;
  local_128._M_rehash_policy._M_next_resize =
       (other->m_derived_xpubs)._M_h._M_rehash_policy._M_next_resize;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_b0._0_8_ = &local_128;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_128,
             (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)other,(_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_false>_>_>
                       *)&local_b0);
  if (local_128._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_128._M_before_begin._M_nxt;
    do {
      for (p_Var9 = _Var8._M_nxt[4]._M_nxt; p_Var9 != (_Hash_node_base *)0x0;
          p_Var9 = p_Var9->_M_nxt) {
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        local_b0.pubkey.vch[0] = 0xff;
        bVar1 = GetCachedDerivedExtPubKey
                          (this,*(uint32_t *)&_Var8._M_nxt[1]._M_nxt,*(uint32_t *)&p_Var9[1]._M_nxt,
                           &local_b0);
        if (bVar1) {
          bVar1 = ::operator==(&local_b0,(CExtPubKey *)((long)&p_Var9[1]._M_nxt + 4));
          if (!bVar1) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"MergeAndDiff","");
            pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_f0,
                              ": New cached derived xpub does not match already cached derived xpub"
                             );
            local_d0 = (size_type *)(pbVar5->_M_dataplus)._M_p;
            paVar7 = &pbVar5->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0 == paVar7) {
              local_c0 = paVar7->_M_allocated_capacity;
              uStack_b8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
              local_d0 = &local_c0;
            }
            else {
              local_c0 = paVar7->_M_allocated_capacity;
            }
            local_c8 = pbVar5->_M_string_length;
            (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
            pbVar5->_M_string_length = 0;
            (pbVar5->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_006e5c71;
          }
        }
        else {
          local_d0._0_4_ = *(undefined4 *)&_Var8._M_nxt[1]._M_nxt;
          local_f0._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var9[1]._M_nxt;
          p_Var2 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this,(key_type *)&local_d0);
          pmVar3 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](p_Var2,(key_type *)&local_f0);
          puVar11 = (undefined4 *)((long)&p_Var9[1]._M_nxt + 4);
          puVar10 = puVar11;
          pmVar12 = pmVar3;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined4 *)pmVar12->version = *puVar10;
            puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
            pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
          }
          (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&p_Var9[0xf]._M_nxt + 4);
          local_d0 = (size_type *)CONCAT44(local_d0._4_4_,*(undefined4 *)&_Var8._M_nxt[1]._M_nxt);
          local_f0._M_dataplus._M_p._0_4_ = *(undefined4 *)&p_Var9[1]._M_nxt;
          p_Var2 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)__return_storage_ptr__,(key_type *)&local_d0);
          pmVar3 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](p_Var2,(key_type *)&local_f0);
          pmVar12 = pmVar3;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(undefined4 *)pmVar12->version = *puVar11;
            puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
            pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
          }
          (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&p_Var9[0xf]._M_nxt + 4);
        }
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_128);
  local_128._M_buckets = (__buckets_ptr)0x0;
  local_128._M_bucket_count = (other->m_last_hardened_xpubs)._M_h._M_bucket_count;
  local_128._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_128._M_element_count = (other->m_last_hardened_xpubs)._M_h._M_element_count;
  local_128._M_rehash_policy._M_max_load_factor =
       (other->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_max_load_factor;
  local_128._M_rehash_policy._4_4_ =
       *(undefined4 *)&(other->m_last_hardened_xpubs)._M_h._M_rehash_policy.field_0x4;
  local_128._M_rehash_policy._M_next_resize =
       (other->m_last_hardened_xpubs)._M_h._M_rehash_policy._M_next_resize;
  local_128._M_single_bucket = (__node_base_ptr)0x0;
  local_b0._0_8_ =
       (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        *)&local_128;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<unsigned_int_const,CExtPubKey>,false>>>>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_128,&(other->m_last_hardened_xpubs)._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_unsigned_int,_CExtPubKey>,_false>_>_>
              *)&local_b0);
  if (local_128._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_128._M_before_begin._M_nxt;
    do {
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_b0.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      local_b0.pubkey.vch[0] = 0xff;
      bVar1 = GetCachedLastHardenedExtPubKey(this,*(uint32_t *)&_Var8._M_nxt[1]._M_nxt,&local_b0);
      if (bVar1) {
        bVar1 = ::operator==(&local_b0,(CExtPubKey *)((long)&_Var8._M_nxt[1]._M_nxt + 4));
        if (!bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"MergeAndDiff","");
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f0,
                          ": New cached last hardened xpub does not match already cached last hardened xpub"
                         );
          local_d0 = (size_type *)(pbVar5->_M_dataplus)._M_p;
          paVar7 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0 == paVar7) {
            local_c0 = paVar7->_M_allocated_capacity;
            uStack_b8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_d0 = &local_c0;
          }
          else {
            local_c0 = paVar7->_M_allocated_capacity;
          }
          local_c8 = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar4,(string *)&local_d0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_006e5c71;
        }
      }
      else {
        local_d0._0_4_ = *(undefined4 *)&_Var8._M_nxt[1]._M_nxt;
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->m_last_hardened_xpubs,(key_type *)&local_d0);
        puVar11 = (undefined4 *)((long)&_Var8._M_nxt[1]._M_nxt + 4);
        puVar10 = puVar11;
        pmVar12 = pmVar3;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)pmVar12->version = *puVar10;
          puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
          pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
        }
        (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&_Var8._M_nxt[0xf]._M_nxt + 4);
        local_d0 = (size_type *)CONCAT44(local_d0._4_4_,*(undefined4 *)&_Var8._M_nxt[1]._M_nxt);
        pmVar3 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&__return_storage_ptr__->m_last_hardened_xpubs,
                              (key_type *)&local_d0);
        pmVar12 = pmVar3;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined4 *)pmVar12->version = *puVar11;
          puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
          pmVar12 = (mapped_type *)((long)pmVar12 + (ulong)bVar13 * -8 + 4);
        }
        (pmVar3->pubkey).vch[0x40] = *(uchar *)((long)&_Var8._M_nxt[0xf]._M_nxt + 4);
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_006e5c71:
  __stack_chk_fail();
}

Assistant:

DescriptorCache DescriptorCache::MergeAndDiff(const DescriptorCache& other)
{
    DescriptorCache diff;
    for (const auto& parent_xpub_pair : other.GetCachedParentExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedParentExtPubKey(parent_xpub_pair.first, xpub)) {
            if (xpub != parent_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached parent xpub does not match already cached parent xpub");
            }
            continue;
        }
        CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
        diff.CacheParentExtPubKey(parent_xpub_pair.first, parent_xpub_pair.second);
    }
    for (const auto& derived_xpub_map_pair : other.GetCachedDerivedExtPubKeys()) {
        for (const auto& derived_xpub_pair : derived_xpub_map_pair.second) {
            CExtPubKey xpub;
            if (GetCachedDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, xpub)) {
                if (xpub != derived_xpub_pair.second) {
                    throw std::runtime_error(std::string(__func__) + ": New cached derived xpub does not match already cached derived xpub");
                }
                continue;
            }
            CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
            diff.CacheDerivedExtPubKey(derived_xpub_map_pair.first, derived_xpub_pair.first, derived_xpub_pair.second);
        }
    }
    for (const auto& lh_xpub_pair : other.GetCachedLastHardenedExtPubKeys()) {
        CExtPubKey xpub;
        if (GetCachedLastHardenedExtPubKey(lh_xpub_pair.first, xpub)) {
            if (xpub != lh_xpub_pair.second) {
                throw std::runtime_error(std::string(__func__) + ": New cached last hardened xpub does not match already cached last hardened xpub");
            }
            continue;
        }
        CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
        diff.CacheLastHardenedExtPubKey(lh_xpub_pair.first, lh_xpub_pair.second);
    }
    return diff;
}